

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msghash32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  code *pcVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int is_nonce_valid;
  int overflow;
  secp256k1_scalar non;
  secp256k1_ge r;
  uchar nonce32 [32];
  secp256k1_scalar msg;
  secp256k1_scalar sec;
  secp256k1_scalar n;
  uchar b [32];
  uint local_260;
  uint local_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  uint local_234;
  int local_230;
  uint local_22c;
  uchar *local_228;
  void *local_220;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  secp256k1_ecdsa_signature *local_1f0;
  secp256k1_nonce_function local_1e8;
  uchar *local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  secp256k1_scalar local_158;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  uchar local_d8 [32];
  secp256k1_scalar local_b8;
  secp256k1_scalar local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  uchar local_58 [40];
  
  local_220 = noncedata;
  if ((ctx->ecmult_gen_ctx).built == 0) {
    secp256k1_ecdsa_sign_cold_4();
  }
  else if (msghash32 == (uchar *)0x0) {
    secp256k1_ecdsa_sign_cold_3();
  }
  else if (signature == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_ecdsa_sign_cold_2();
  }
  else {
    if (seckey != (uchar *)0x0) {
      local_218 = (undefined1  [16])0x0;
      local_208 = (undefined1  [16])0x0;
      local_258 = (undefined1  [16])0x0;
      local_248 = (undefined1  [16])0x0;
      pcVar14 = nonce_function_rfc6979;
      if (noncefp != (secp256k1_nonce_function)0x0) {
        pcVar14 = noncefp;
      }
      local_228 = seckey;
      local_1f0 = signature;
      secp256k1_scalar_set_b32(&local_98,seckey,(int *)local_1d8);
      local_234 = (uint)(((local_98.d[2] != 0 || local_98.d[3] != 0) ||
                         (local_98.d[1] != 0 || local_98.d[0] != 0)) && local_1d8._0_4_ == 0);
      uVar4 = local_234 ^ 1;
      local_1d8._0_4_ = uVar4;
      uVar1 = (long)(int)uVar4 - 1;
      local_98.d[1] = local_98.d[1] & uVar1;
      local_98.d[0] = (ulong)uVar4 | local_98.d[0] & uVar1;
      local_98.d[3] = uVar1 & local_98.d[3];
      local_98.d[2] = local_98.d[2] & uVar1;
      uVar4 = 0;
      secp256k1_scalar_set_b32(&local_b8,msghash32,(int *)0x0);
      local_1e8 = pcVar14;
      local_1e0 = msghash32;
      iVar5 = (*pcVar14)(local_d8,msghash32,local_228,(uchar *)0x0,local_220,0);
      bVar15 = iVar5 != 0;
      if (bVar15) {
        uVar9 = 1;
        do {
          local_260 = (uint)bVar15;
          secp256k1_scalar_set_b32(&local_158,local_d8,(int *)local_1d8);
          local_25c = (uint)(((local_158.d[3] != 0 || local_158.d[1] != 0) ||
                             (local_158.d[2] != 0 || local_158.d[0] != 0)) && local_1d8._0_4_ == 0);
          if (ctx->declassify != 0) {
            local_1d8._8_8_ = &local_25c;
            local_1d8._0_8_ = 0x4d430002;
            local_1c8 = ZEXT816(4);
            local_1b8 = ZEXT816(0);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_138._8_8_;
            local_138 = auVar3 << 0x40;
          }
          if (local_25c != 0) {
            local_230 = 0;
            secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,(secp256k1_gej *)local_1d8,&local_158);
            secp256k1_ge_set_gej((secp256k1_ge *)local_138,(secp256k1_gej *)local_1d8);
            secp256k1_fe_impl_normalize((secp256k1_fe *)local_138);
            secp256k1_fe_impl_normalize((secp256k1_fe *)(local_118 + 8));
            secp256k1_fe_impl_get_b32(local_58,(secp256k1_fe *)local_138);
            secp256k1_scalar_set_b32((secp256k1_scalar *)local_218,local_58,&local_230);
            secp256k1_scalar_mul
                      ((secp256k1_scalar *)local_78,(secp256k1_scalar *)local_218,&local_98);
            secp256k1_scalar_add
                      ((secp256k1_scalar *)local_78,(secp256k1_scalar *)local_78,&local_b8);
            secp256k1_scalar_inverse((secp256k1_scalar *)local_258,&local_158);
            secp256k1_scalar_mul
                      ((secp256k1_scalar *)local_258,(secp256k1_scalar *)local_258,
                       (secp256k1_scalar *)local_78);
            local_68 = (undefined1  [16])0x0;
            local_78 = (undefined1  [16])0x0;
            local_168 = (undefined1  [16])0x0;
            local_178 = (undefined1  [16])0x0;
            local_188 = (undefined1  [16])0x0;
            local_198 = (undefined1  [16])0x0;
            local_1a8 = (undefined1  [16])0x0;
            local_1b8 = (undefined1  [16])0x0;
            local_1c8 = (undefined1  [16])0x0;
            local_1d8 = (undefined1  [16])0x0;
            local_e8._0_4_ = 0;
            local_e8._4_4_ = 0;
            local_f8 = (undefined1  [16])0x0;
            local_108 = (undefined1  [16])0x0;
            local_118 = (undefined1  [16])0x0;
            local_128 = (undefined1  [16])0x0;
            local_138 = (undefined1  [16])0x0;
            uVar10 = local_248._12_4_ >> 0x1f;
            uVar4 = uVar10 ^ 1;
            uVar13 = uVar4;
            if (local_248._0_8_ == 0xffffffffffffffff) {
              uVar13 = 0;
            }
            if (0x5d576e7357a4501c < (ulong)local_258._8_8_) {
              uVar4 = 0;
            }
            uVar4 = (uVar4 | uVar13 | (ulong)local_248._8_8_ < 0x7fffffffffffffff) ^ 1;
            local_22c = 0;
            if (0xdfe92f46681b20a0 < (ulong)local_258._0_8_) {
              local_22c = uVar4;
            }
            if (0x5d576e7357a4501d < (ulong)local_258._8_8_) {
              local_22c = uVar4;
            }
            local_22c = local_22c | uVar10;
            uVar7 = -(long)(int)local_22c;
            lVar11 = (uVar7 & 0xbfd25e8cd0364142) + (local_258._0_8_ ^ uVar7);
            uVar1 = (ulong)CARRY8(uVar7 & 0xbfd25e8cd0364142,local_258._0_8_ ^ uVar7);
            uVar2 = (uVar7 & 0xbaaedce6af48a03b) + (local_258._8_8_ ^ uVar7);
            lVar12 = uVar2 + uVar1;
            uVar1 = (ulong)(CARRY8(uVar7 & 0xbaaedce6af48a03b,local_258._8_8_ ^ uVar7) ||
                           CARRY8(uVar2,uVar1));
            uVar2 = (uVar7 & 0xfffffffffffffffe) + (local_248._0_8_ ^ uVar7);
            lVar8 = uVar2 + uVar1;
            lVar6 = ((local_248._8_8_ ^ uVar7) - (long)(int)local_22c) +
                    (ulong)(CARRY8(uVar7 & 0xfffffffffffffffe,local_248._0_8_ ^ uVar7) ||
                           CARRY8(uVar2,uVar1));
            if (((local_248._0_8_ == 0 && local_248._8_8_ == 0) && local_258._8_8_ == 0) &&
                local_258._0_8_ == 0) {
              lVar11 = 0;
              lVar12 = 0;
              lVar8 = 0;
              lVar6 = 0;
            }
            local_258._8_8_ = lVar12;
            local_258._0_8_ = lVar11;
            local_248._8_8_ = lVar6;
            local_248._0_8_ = lVar8;
            bVar15 = (((lVar12 != 0 || lVar11 != 0) || lVar8 != 0) || lVar6 != 0) &&
                     ((local_218._8_8_ != 0 || local_208._8_8_ != 0) ||
                     (local_218._0_8_ != 0 || local_208._0_8_ != 0));
            local_260 = (uint)bVar15;
            if (ctx->declassify != 0) {
              local_1d8._8_8_ = &local_260;
              local_1d8._0_8_ = 0x4d430002;
              local_1c8 = ZEXT816(4);
              local_1b8 = ZEXT816(0);
              local_138 = ZEXT816(0) << 0x40;
            }
            uVar4 = (uint)bVar15;
            if (uVar4 != 0) break;
          }
          uVar4 = 0;
          iVar5 = (*local_1e8)(local_d8,local_1e0,local_228,(uchar *)0x0,local_220,uVar9);
          uVar9 = uVar9 + 1;
          bVar15 = iVar5 != 0;
        } while (bVar15);
      }
      uVar9 = (uint)((uVar4 & local_234) == 0);
      lVar8 = (long)(int)uVar9 + -1;
      auVar16._8_4_ = (int)lVar8;
      auVar16._0_8_ = lVar8;
      auVar16._12_4_ = (int)((ulong)lVar8 >> 0x20);
      local_218 = local_218 & auVar16;
      auVar16 = auVar16 & local_208;
      lVar8 = (long)(int)uVar9 + -1;
      auVar17._8_4_ = (int)lVar8;
      auVar17._0_8_ = lVar8;
      auVar17._12_4_ = (int)((ulong)lVar8 >> 0x20);
      local_258 = local_258 & auVar17;
      auVar17 = auVar17 & local_248;
      local_208._0_8_ = auVar16._0_8_;
      local_208._8_8_ = auVar16._8_8_;
      *(undefined8 *)(local_1f0->data + 0x10) = local_208._0_8_;
      *(undefined8 *)(local_1f0->data + 0x18) = local_208._8_8_;
      *(undefined8 *)local_1f0->data = local_218._0_8_;
      *(undefined8 *)(local_1f0->data + 8) = local_218._8_8_;
      local_248._0_8_ = auVar17._0_8_;
      local_248._8_8_ = auVar17._8_8_;
      *(undefined8 *)(local_1f0->data + 0x20) = local_258._0_8_;
      *(undefined8 *)(local_1f0->data + 0x28) = local_258._8_8_;
      *(undefined8 *)(local_1f0->data + 0x30) = local_248._0_8_;
      *(undefined8 *)(local_1f0->data + 0x38) = local_248._8_8_;
      return uVar4 & local_234;
    }
    secp256k1_ecdsa_sign_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msghash32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, msghash32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}